

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void amrex::anon_unknown_12::anon_unknown_0::sgetval<double>
               (Table *table,string *name,double *ptr,int ival,int occurrence)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = squeryval<double>(table,name,ptr,ival,occurrence);
  if (bVar1) {
    return;
  }
  poVar2 = ErrorStream();
  std::operator<<(poVar2,"ParmParse::getval ");
  if (-1 < occurrence) {
    poVar2 = ErrorStream();
    poVar2 = std::operator<<(poVar2,"occurrence number ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
    std::operator<<(poVar2," of ");
  }
  poVar2 = ErrorStream();
  poVar2 = std::operator<<(poVar2,"ParmParse::getval(): ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2," not found in table");
  std::operator<<(poVar2,'\n');
  poVar2 = ErrorStream();
  ParmParse::dumpTable(poVar2,false);
  Abort_host((char *)0x0);
  return;
}

Assistant:

void
sgetval (const ParmParse::Table& table,
         const std::string& name,
         T&           ptr,
         int          ival,
         int          occurrence)
{
    if ( squeryval(table, name,ptr,ival,occurrence) == 0 )
    {
        amrex::ErrorStream() << "ParmParse::getval ";
        if ( occurrence >= 0 )
        {
            amrex::ErrorStream() << "occurrence number "
                      << occurrence
                      << " of ";
        }

        amrex::ErrorStream() << "ParmParse::getval(): "
                  << name
                  << " not found in table"
                  << '\n';
        ParmParse::dumpTable(amrex::ErrorStream());
        amrex::Abort();
    }
}